

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

double gettime_user_sys(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = stopclock.ru_utime.tv_usec - startclock.ru_utime.tv_usec;
  lVar3 = lVar2 + 1000000;
  if (-1 < lVar2) {
    lVar3 = lVar2;
  }
  lVar4 = stopclock.ru_stime.tv_usec - startclock.ru_stime.tv_usec;
  lVar5 = lVar4 + 1000000;
  if (-1 < lVar4) {
    lVar5 = lVar4;
  }
  lVar1 = lVar5 + lVar3;
  lVar3 = lVar5 + -1000000 + lVar3;
  if (lVar1 < 1000000) {
    lVar3 = lVar1;
  }
  return (double)lVar3 / 1000.0 +
         (double)(long)(((((stopclock.ru_utime.tv_sec - startclock.ru_utime.tv_sec) +
                           stopclock.ru_stime.tv_sec + (lVar2 >> 0x3f)) - startclock.ru_stime.tv_sec
                         ) + (lVar4 >> 0x3f) + (ulong)(999999 < lVar1)) * 1000);
}

Assistant:

double gettime_user_sys(void)
{
	struct timeval result_user;
	struct timeval result_sys;
	struct timeval result;
	timersub(&stopclock.ru_utime, &startclock.ru_utime, &result_user);
	timersub(&stopclock.ru_stime, &startclock.ru_stime, &result_sys);
	timeradd(&result_user, &result_sys, &result);
	return (double)(result.tv_sec*1000)+(double)(result.tv_usec)/1e3;
}